

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

XMLError __thiscall tinyxml2::XMLDocument::LoadFile(XMLDocument *this,FILE *fp)

{
  int iVar1;
  XMLDocument *__n;
  char *pcVar2;
  XMLDocument *this_00;
  FILE *in_RSI;
  XMLDocument *in_RDI;
  size_t read;
  size_t size;
  long filelength;
  XMLDocument *in_stack_ffffffffffffffd0;
  XMLError local_4;
  
  Clear(in_stack_ffffffffffffffd0);
  fseek(in_RSI,0,0);
  iVar1 = fgetc(in_RSI);
  if ((iVar1 == -1) && (iVar1 = ferror(in_RSI), iVar1 != 0)) {
    SetError(in_RDI,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    return in_RDI->_errorID;
  }
  fseek(in_RSI,0,2);
  __n = (XMLDocument *)ftell(in_RSI);
  fseek(in_RSI,0,0);
  if (__n == (XMLDocument *)0xffffffffffffffff) {
    SetError(in_RDI,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    local_4 = in_RDI->_errorID;
  }
  else if (__n == (XMLDocument *)0xffffffffffffffff) {
    SetError(in_RDI,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
    local_4 = in_RDI->_errorID;
  }
  else if (__n == (XMLDocument *)0x0) {
    SetError(in_RDI,XML_ERROR_EMPTY_DOCUMENT,(char *)0x0,(char *)0x0);
    local_4 = in_RDI->_errorID;
  }
  else {
    pcVar2 = (char *)operator_new__((ulong)((long)&(__n->super_XMLNode)._vptr_XMLNode + 1));
    in_RDI->_charBuffer = pcVar2;
    this_00 = (XMLDocument *)fread(in_RDI->_charBuffer,1,(size_t)__n,in_RSI);
    if (this_00 == __n) {
      in_RDI->_charBuffer[(long)__n] = '\0';
      Parse(this_00);
      local_4 = in_RDI->_errorID;
    }
    else {
      SetError(in_RDI,XML_ERROR_FILE_READ_ERROR,(char *)0x0,(char *)0x0);
      local_4 = in_RDI->_errorID;
    }
  }
  return local_4;
}

Assistant:

XMLError XMLDocument::LoadFile( FILE* fp )
{
    Clear();

    fseek( fp, 0, SEEK_SET );
    if ( fgetc( fp ) == EOF && ferror( fp ) != 0 ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    fseek( fp, 0, SEEK_END );
    const long filelength = ftell( fp );
    fseek( fp, 0, SEEK_SET );
    if ( filelength == -1L ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( (unsigned long)filelength >= (size_t)-1 ) {
        // Cannot handle files which won't fit in buffer together with null terminator
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    if ( filelength == 0 ) {
        SetError( XML_ERROR_EMPTY_DOCUMENT, 0, 0 );
        return _errorID;
    }

    const size_t size = filelength;
    _charBuffer = new char[size+1];
    size_t read = fread( _charBuffer, 1, size, fp );
    if ( read != size ) {
        SetError( XML_ERROR_FILE_READ_ERROR, 0, 0 );
        return _errorID;
    }

    _charBuffer[size] = 0;

    Parse();
    return _errorID;
}